

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_space.cpp
# Opt level: O0

void __thiscall Memory_space::write8(Memory_space *this,uint32_t address,uint8_t data)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint byte_offset;
  uint page_index;
  uint8_t data_local;
  uint32_t address_local;
  Memory_space *this_local;
  
  uVar3 = address >> ((byte)this->page_bits & 0x1f) & this->page_table_mask;
  uVar1 = this->page_mask;
  if ((undefined1  [16])((undefined1  [16])this->page_table[uVar3] & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    puVar2 = (uint8_t *)calloc((ulong)this->page_size,1);
    this->page_table[uVar3].data = puVar2;
    *(byte *)(this->page_table + uVar3) = *(byte *)(this->page_table + uVar3) & 0xfe | 1;
  }
  this->page_table[uVar3].data[address & uVar1] = data;
  return;
}

Assistant:

void Memory_space::write8(uint32_t address, uint8_t data)
{
	unsigned page_index = (address >> page_bits) & page_table_mask;
	unsigned byte_offset = address & page_mask;
	if ( ! page_table[page_index].present) {
		page_table[page_index].data = (uint8_t*) calloc(page_size, 1);
		page_table[page_index].present = 1;
	}
	*(page_table[page_index].data + byte_offset) = data;
}